

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O3

CURLMcode multi_socket(Curl_multi *multi,_Bool checkall,curl_socket_t s,int ev_bitmask,
                      int *running_handles)

{
  uint uVar1;
  uint uVar2;
  connectdata *pcVar3;
  CURLMcode CVar4;
  CURLMcode CVar5;
  time_t tVar6;
  long *plVar7;
  Curl_tree *pCVar8;
  curl_llist_element *pcVar9;
  int iVar10;
  undefined7 in_register_00000031;
  Curl_easy *pCVar11;
  curltime now;
  curltime cVar12;
  curltime i;
  curltime now_00;
  Curl_tree *t;
  sigpipe_ignore pipe_st;
  Curl_tree *local_e0;
  int *local_d8;
  anon_union_8_2_5ad2d23e_for___sigaction_handler local_d0 [19];
  char local_38;
  
  cVar12 = Curl_now();
  tVar6 = cVar12.tv_sec;
  if ((int)CONCAT71(in_register_00000031,checkall) != 0) {
    CVar4 = curl_multi_perform(multi,running_handles);
    if (CVar4 == CURLM_BAD_HANDLE) {
      return CURLM_BAD_HANDLE;
    }
    pCVar11 = multi->easyp;
    if (CVar4 != CURLM_OK || pCVar11 == (Curl_easy *)0x0) {
      return CVar4;
    }
    do {
      CVar4 = singlesocket(multi,pCVar11);
      if (CVar4 != CURLM_OK) {
        return CVar4;
      }
      pCVar11 = pCVar11->next;
    } while (pCVar11 != (Curl_easy *)0x0);
    return CURLM_OK;
  }
  iVar10 = cVar12.tv_usec;
  local_d8 = running_handles;
  if (s == -1) {
    (multi->timer_lastcall).tv_sec = 0;
    *(undefined8 *)&(multi->timer_lastcall).tv_usec = 0;
  }
  else {
    local_d0[0]._0_4_ = s;
    plVar7 = (long *)Curl_hash_pick(&multi->sockhash,local_d0,4);
    if (plVar7 != (long *)0x0) {
      pCVar11 = (Curl_easy *)*plVar7;
      if (pCVar11->magic != 0xc0dedbad) {
        return CURLM_INTERNAL_ERROR;
      }
      pcVar3 = pCVar11->easy_conn;
      if ((pcVar3 != (connectdata *)0x0) &&
         ((((ev_bitmask & 2U) != 0 &&
           (pcVar9 = (pcVar3->send_pipe).head, pcVar9 != (curl_llist_element *)0x0)) ||
          (((ev_bitmask & 1U) != 0 &&
           (pcVar9 = (pcVar3->recv_pipe).head, pcVar9 != (curl_llist_element *)0x0)))))) {
        pCVar11 = (Curl_easy *)pcVar9->ptr;
      }
      pcVar3 = pCVar11->easy_conn;
      if ((pcVar3 != (connectdata *)0x0) && ((pcVar3->handler->flags & 8) == 0)) {
        pcVar3->cselect_bits = ev_bitmask;
      }
      uVar2._0_1_ = (pCVar11->set).no_signal;
      uVar2._1_1_ = (pCVar11->set).global_dns_cache;
      uVar2._2_1_ = (pCVar11->set).tcp_nodelay;
      uVar2._3_1_ = (pCVar11->set).ignorecl;
      sigpipe_ignore((Curl_easy *)(ulong)uVar2,(sigpipe_ignore *)local_d0);
      now._12_4_ = 0;
      now.tv_sec = SUB128(cVar12._0_12_,0);
      now.tv_usec = SUB124(cVar12._0_12_,8);
      CVar4 = multi_runsingle(multi,now,pCVar11);
      if (local_38 == '\0') {
        sigaction(0xd,(sigaction *)local_d0,(sigaction *)0x0);
      }
      pcVar3 = pCVar11->easy_conn;
      if ((pcVar3 != (connectdata *)0x0) && ((pcVar3->handler->flags & 8) == 0)) {
        pcVar3->cselect_bits = 0;
      }
      if (CVar4 < CURLM_BAD_HANDLE) {
        CVar4 = singlesocket(multi,pCVar11);
        if (CVar4 != CURLM_OK) {
          return CVar4;
        }
        CVar4 = CURLM_OK;
      }
      cVar12 = Curl_now();
      tVar6 = cVar12.tv_sec;
      iVar10 = cVar12.tv_usec;
      goto LAB_00416869;
    }
  }
  CVar4 = CURLM_OK;
LAB_00416869:
  pCVar11 = (Curl_easy *)0x0;
  do {
    if (pCVar11 != (Curl_easy *)0x0) {
      uVar1._0_1_ = (pCVar11->set).no_signal;
      uVar1._1_1_ = (pCVar11->set).global_dns_cache;
      uVar1._2_1_ = (pCVar11->set).tcp_nodelay;
      uVar1._3_1_ = (pCVar11->set).ignorecl;
      sigpipe_ignore((Curl_easy *)(ulong)uVar1,(sigpipe_ignore *)local_d0);
      cVar12.tv_usec = iVar10;
      cVar12.tv_sec = tVar6;
      cVar12._12_4_ = 0;
      CVar4 = multi_runsingle(multi,cVar12,pCVar11);
      if (local_38 == '\0') {
        sigaction(0xd,(sigaction *)local_d0,(sigaction *)0x0);
      }
      if (CVar4 < CURLM_BAD_HANDLE) {
        CVar5 = singlesocket(multi,pCVar11);
        CVar4 = CURLM_OK;
        if (CVar5 != CURLM_OK) {
          return CVar5;
        }
      }
    }
    i.tv_usec = iVar10;
    i.tv_sec = tVar6;
    i._12_4_ = 0;
    pCVar8 = Curl_splaygetbest(i,multi->timetree,&local_e0);
    multi->timetree = pCVar8;
    if (local_e0 == (Curl_tree *)0x0) break;
    pCVar11 = (Curl_easy *)local_e0->payload;
    now_00.tv_usec = iVar10;
    now_00.tv_sec = tVar6;
    now_00._12_4_ = 0;
    add_next_timeout(now_00,multi,pCVar11);
  } while (local_e0 != (Curl_tree *)0x0);
  *local_d8 = multi->num_alive;
  return CVar4;
}

Assistant:

static CURLMcode multi_socket(struct Curl_multi *multi,
                              bool checkall,
                              curl_socket_t s,
                              int ev_bitmask,
                              int *running_handles)
{
  CURLMcode result = CURLM_OK;
  struct Curl_easy *data = NULL;
  struct Curl_tree *t;
  struct curltime now = Curl_now();

  if(checkall) {
    /* *perform() deals with running_handles on its own */
    result = curl_multi_perform(multi, running_handles);

    /* walk through each easy handle and do the socket state change magic
       and callbacks */
    if(result != CURLM_BAD_HANDLE) {
      data = multi->easyp;
      while(data && !result) {
        result = singlesocket(multi, data);
        data = data->next;
      }
    }

    /* or should we fall-through and do the timer-based stuff? */
    return result;
  }
  if(s != CURL_SOCKET_TIMEOUT) {

    struct Curl_sh_entry *entry = sh_getentry(&multi->sockhash, s);

    if(!entry)
      /* Unmatched socket, we can't act on it but we ignore this fact.  In
         real-world tests it has been proved that libevent can in fact give
         the application actions even though the socket was just previously
         asked to get removed, so thus we better survive stray socket actions
         and just move on. */
      ;
    else {
      SIGPIPE_VARIABLE(pipe_st);

      data = entry->easy;

      if(data->magic != CURLEASY_MAGIC_NUMBER)
        /* bad bad bad bad bad bad bad */
        return CURLM_INTERNAL_ERROR;

      /* If the pipeline is enabled, take the handle which is in the head of
         the pipeline. If we should write into the socket, take the send_pipe
         head.  If we should read from the socket, take the recv_pipe head. */
      if(data->easy_conn) {
        if((ev_bitmask & CURL_POLL_OUT) &&
           data->easy_conn->send_pipe.head)
          data = data->easy_conn->send_pipe.head->ptr;
        else if((ev_bitmask & CURL_POLL_IN) &&
                data->easy_conn->recv_pipe.head)
          data = data->easy_conn->recv_pipe.head->ptr;
      }

      if(data->easy_conn &&
         !(data->easy_conn->handler->flags & PROTOPT_DIRLOCK))
        /* set socket event bitmask if they're not locked */
        data->easy_conn->cselect_bits = ev_bitmask;

      sigpipe_ignore(data, &pipe_st);
      result = multi_runsingle(multi, now, data);
      sigpipe_restore(&pipe_st);

      if(data->easy_conn &&
         !(data->easy_conn->handler->flags & PROTOPT_DIRLOCK))
        /* clear the bitmask only if not locked */
        data->easy_conn->cselect_bits = 0;

      if(CURLM_OK >= result) {
        /* get the socket(s) and check if the state has been changed since
           last */
        result = singlesocket(multi, data);
        if(result)
          return result;
      }

      /* Now we fall-through and do the timer-based stuff, since we don't want
         to force the user to have to deal with timeouts as long as at least
         one connection in fact has traffic. */

      data = NULL; /* set data to NULL again to avoid calling
                      multi_runsingle() in case there's no need to */
      now = Curl_now(); /* get a newer time since the multi_runsingle() loop
                           may have taken some time */
    }
  }
  else {
    /* Asked to run due to time-out. Clear the 'lastcall' variable to force
       update_timer() to trigger a callback to the app again even if the same
       timeout is still the one to run after this call. That handles the case
       when the application asks libcurl to run the timeout prematurely. */
    memset(&multi->timer_lastcall, 0, sizeof(multi->timer_lastcall));
  }

  /*
   * The loop following here will go on as long as there are expire-times left
   * to process in the splay and 'data' will be re-assigned for every expired
   * handle we deal with.
   */
  do {
    /* the first loop lap 'data' can be NULL */
    if(data) {
      SIGPIPE_VARIABLE(pipe_st);

      sigpipe_ignore(data, &pipe_st);
      result = multi_runsingle(multi, now, data);
      sigpipe_restore(&pipe_st);

      if(CURLM_OK >= result) {
        /* get the socket(s) and check if the state has been changed since
           last */
        result = singlesocket(multi, data);
        if(result)
          return result;
      }
    }

    /* Check if there's one (more) expired timer to deal with! This function
       extracts a matching node if there is one */

    multi->timetree = Curl_splaygetbest(now, multi->timetree, &t);
    if(t) {
      data = t->payload; /* assign this for next loop */
      (void)add_next_timeout(now, multi, t->payload);
    }

  } while(t);

  *running_handles = multi->num_alive;
  return result;
}